

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<float>_>::MultAddScalar
          (TPZTransfer<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  TNode *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  TPZFMatrix<std::complex<float>_> zloc;
  TPZFMatrix<std::complex<float>_> xloc;
  ulong uVar17;
  int local_210;
  TPZFMatrix<std::complex<float>_> local_1f8;
  TPZFMatrix<std::complex<float>_> local_168;
  TPZFMatrix<std::complex<float>_> local_d8;
  
  iVar9 = (int)alpha._M_value;
  if (iVar9 == 0) {
    lVar8 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar8 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  iVar10 = iVar9;
  if (lVar8 != (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  uVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if ((uVar6 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
     (uVar6 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    uVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  uVar3 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar10);
  if (0 < (int)uVar6) {
    uVar7 = uVar3 & 0x7fffffff;
    uVar17 = 0;
    do {
      local_210 = (int)uVar3;
      if (iVar9 == 0) {
        if (0 < local_210) {
          uVar13 = 0;
          do {
            pTVar4 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar8 = (long)pTVar4[uVar13].dim;
            if ((lVar8 != 0) && (lVar12 = (long)(this->fColPosition).fStore[uVar13], lVar12 != -1))
            {
              uVar1 = (this->fNumberofColumnBlocks).fStore[uVar13];
              uVar14 = (ulong)uVar1;
              if (uVar14 != 0) {
                iVar10 = pTVar4[uVar13].pos;
                if (((iVar10 < 0) ||
                    (lVar15 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
                    lVar15 <= iVar10)) ||
                   ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    (long)uVar17)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_d8.fElem = z->fElem + lVar15 * uVar17 + (long)iVar10;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar8;
                local_d8.fGiven = local_d8.fElem;
                local_d8.fSize = lVar8;
                TPZVec<int>::TPZVec(&local_d8.fPivot.super_TPZVec<int>,0);
                local_d8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_01815498;
                local_d8.fPivot.super_TPZVec<int>.fStore = local_d8.fPivot.fExtAlloc;
                local_d8.fPivot.super_TPZVec<int>.fNElements = 0;
                local_d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
                local_d8.fWork.fStore = (complex<float> *)0x0;
                local_d8.fWork.fNElements = 0;
                local_d8.fWork.fNAlloc = 0;
                if (0 < (int)uVar1) {
                  do {
                    pTVar4 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                    iVar10 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar12];
                    iVar2 = pTVar4[iVar10].dim;
                    lVar15 = (long)iVar2;
                    local_1f8.fElem =
                         x->fElem +
                         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         uVar17 + (long)pTVar4[iVar10].pos;
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed
                         = '\0';
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive
                         = '\0';
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow =
                         lVar15;
                    local_1f8.fGiven = local_1f8.fElem;
                    local_1f8.fSize = lVar15;
                    TPZVec<int>::TPZVec(&local_1f8.fPivot.super_TPZVec<int>,0);
                    local_1f8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                         (_func_int **)&PTR__TPZManVector_01815498;
                    local_1f8.fPivot.super_TPZVec<int>.fStore = local_1f8.fPivot.fExtAlloc;
                    local_1f8.fPivot.super_TPZVec<int>.fNElements = 0;
                    local_1f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                    local_1f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
                    local_1f8.fWork.fStore = (complex<float> *)0x0;
                    local_1f8.fWork.fNElements = 0;
                    local_1f8.fWork.fNAlloc = 0;
                    if (iVar2 == 0) {
                      local_1f8.fElem = (complex<float> *)0x0;
                    }
                    local_168.fElem =
                         (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                         (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar12];
                    local_168.fSize = lVar15 * lVar8;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed
                         = '\0';
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive
                         = '\0';
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar8
                    ;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol =
                         lVar15;
                    local_168.fGiven = local_168.fElem;
                    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
                    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec =
                         (_func_int **)&PTR__TPZManVector_01815498;
                    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
                    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
                    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
                    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
                    local_168.fWork.fStore = (complex<float> *)0x0;
                    local_168.fWork.fNElements = 0;
                    local_168.fWork.fNAlloc = 0;
                    if (iVar2 == 0) {
                      local_168.fElem = (complex<float> *)0x0;
                    }
                    TPZFMatrix<std::complex<float>_>::MultAdd
                              (&local_168,&local_1f8,&local_d8,&local_d8,(complex<float>)0x0,beta,
                               (int)uVar17);
                    TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_168);
                    TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_1f8);
                    lVar12 = lVar12 + 1;
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                }
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_d8);
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar7);
        }
      }
      else if (0 < local_210) {
        uVar13 = 0;
        do {
          pTVar4 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
          lVar8 = (long)pTVar4[uVar13].dim;
          if (lVar8 != 0) {
            local_d8.fElem =
                 x->fElem +
                 (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar17 +
                 (long)pTVar4[uVar13].pos;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar8;
            local_d8.fGiven = local_d8.fElem;
            local_d8.fSize = lVar8;
            TPZVec<int>::TPZVec(&local_d8.fPivot.super_TPZVec<int>,0);
            local_d8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_01815498;
            local_d8.fPivot.super_TPZVec<int>.fStore = local_d8.fPivot.fExtAlloc;
            local_d8.fPivot.super_TPZVec<int>.fNElements = 0;
            local_d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
            local_d8.fWork.fStore = (complex<float> *)0x0;
            local_d8.fWork.fNElements = 0;
            local_d8.fWork.fNAlloc = 0;
            lVar12 = (long)(this->fColPosition).fStore[uVar13];
            if ((lVar12 != -1) &&
               (lVar15 = (long)(this->fNumberofColumnBlocks).fStore[uVar13], 0 < lVar15)) {
              do {
                pTVar4 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                iVar10 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar12];
                lVar16 = (long)pTVar4[iVar10].pos;
                iVar10 = pTVar4[iVar10].dim;
                lVar11 = (long)iVar10;
                if ((lVar16 < 0) ||
                   ((lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
                    lVar5 <= lVar16 ||
                    ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                     (long)uVar17)))) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_1f8.fElem = z->fElem + lVar5 * uVar17 + lVar16;
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable
                ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar11;
                local_1f8.fGiven = local_1f8.fElem;
                local_1f8.fSize = lVar11;
                TPZVec<int>::TPZVec(&local_1f8.fPivot.super_TPZVec<int>,0);
                local_1f8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_01815498;
                local_1f8.fPivot.super_TPZVec<int>.fStore = local_1f8.fPivot.fExtAlloc;
                local_1f8.fPivot.super_TPZVec<int>.fNElements = 0;
                local_1f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_1f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
                local_1f8.fWork.fStore = (complex<float> *)0x0;
                local_1f8.fWork.fNElements = 0;
                local_1f8.fWork.fNAlloc = 0;
                if (iVar10 == 0) {
                  local_1f8.fElem = (complex<float> *)0x0;
                }
                local_168.fElem =
                     (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                     (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar12];
                local_168.fSize = lVar11 * lVar8;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable
                ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar8;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
                local_168.fGiven = local_168.fElem;
                TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
                local_168.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_01815498;
                local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
                local_168.fPivot.super_TPZVec<int>.fNElements = 0;
                local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
                local_168.fWork.fStore = (complex<float> *)0x0;
                local_168.fWork.fNElements = 0;
                local_168.fWork.fNAlloc = 0;
                if (iVar10 == 0) {
                  local_168.fElem = (complex<float> *)0x0;
                }
                TPZFMatrix<std::complex<float>_>::MultAdd
                          (&local_168,&local_d8,&local_1f8,&local_1f8,
                           (complex<float>)(alpha._M_value & 0xffffffff),beta,(int)uVar17);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_168);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_1f8);
                lVar12 = lVar12 + 1;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
            TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_d8);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar7);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uVar6 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAddScalar(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  TVar alpha, TVar beta, int opt) const{
	// multiplies the transfer matrix and puts the result in z
	if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
		this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
		this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
	}
	int rows = fRowBlock.MaxBlockSize();
	int xcols = x.Cols();
	int ic, c, r;
	this->PrepareZ(y,z,beta,opt);
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				TPZFMatrix<TVar> zloc(rowblocksize,1,&z(rowblockpos,ic),rowblocksize);
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> xloc(colblocksize,1,&x.g(colblockpos,ic), colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
				}
			}
		} else {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				TPZFMatrix<TVar> xloc(rowblocksize,1,&x.g(rowblockpos,ic),rowblocksize);
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> zloc(colblocksize,1,&z(colblockpos,ic),colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
					col = rowblockpos-1;
					rowblockpos = col+1;
				}
			}
		}
	}
}